

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshio.cpp
# Opt level: O2

vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
* geometrycentral::surface::anon_unknown_18::paramToStdVector
            (vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
             *__return_storage_ptr__,SurfaceMesh *mesh,CornerData<Vector2> *param)

{
  unsigned_long uVar1;
  ParentMeshT *pPVar2;
  bool bVar3;
  unsigned_long uVar4;
  long lVar5;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> local_78;
  RangeSetBase<geometrycentral::surface::FaceRangeF> local_60;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> local_48;
  
  ::std::
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  ::vector(__return_storage_ptr__,mesh->nFacesCount,(allocator_type *)&local_60);
  local_60.iEnd = mesh->nFacesFillCount;
  local_60.iStart = 0;
  local_60.mesh = mesh;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin(&local_78,&local_60);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end(&local_48,&local_60);
  lVar5 = 0;
  while (pPVar2 = local_78.mesh, local_78.iCurr != local_48.iCurr) {
    bVar3 = true;
    uVar1 = ((local_78.mesh)->fHalfedgeArr).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[local_78.iCurr];
    for (uVar4 = uVar1; (bVar3 || (uVar4 != uVar1));
        uVar4 = (pPVar2->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4]) {
      ::std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::push_back
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar5,
                 (param->data).
                 super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data + uVar4);
      bVar3 = false;
    }
    lVar5 = lVar5 + 1;
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Vector2>> paramToStdVector(SurfaceMesh& mesh, CornerData<Vector2>& param) {
  std::vector<std::vector<Vector2>> uv(mesh.nFaces());
  size_t i = 0;
  for (Face f : mesh.faces()) {
    for (Corner c : f.adjacentCorners()) {
      uv[i].push_back(param[c]);
    }
    i++;
  }
  return uv;
}